

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCapsuleShape.cpp
# Opt level: O0

void __thiscall
btCapsuleShape::batchedUnitVectorGetSupportingVertexWithoutMargin
          (btCapsuleShape *this,btVector3 *vectors,btVector3 *supportVerticesOut,int numVectors)

{
  int iVar1;
  btScalar *pbVar2;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  btCapsuleShape *in_RDI;
  btScalar bVar3;
  btVector3 bVar4;
  btVector3 pos_1;
  btVector3 pos;
  btScalar newDot;
  btVector3 vtx;
  btVector3 *vec;
  btScalar maxDot;
  int j;
  btScalar radius;
  undefined4 in_stack_fffffffffffffeb0;
  btScalar in_stack_fffffffffffffeb4;
  btVector3 *in_stack_fffffffffffffeb8;
  btVector3 *in_stack_fffffffffffffec0;
  btScalar local_c0;
  btScalar local_bc;
  btScalar local_b8;
  btVector3 local_b4;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  btScalar local_70 [2];
  btScalar local_68 [2];
  btScalar local_60;
  btScalar local_5c;
  btScalar local_58;
  btVector3 local_54;
  btScalar local_44;
  btVector3 local_40;
  btVector3 *local_30;
  float local_28;
  int local_24;
  btScalar local_20;
  int local_1c;
  long local_18;
  long local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = getRadius((btCapsuleShape *)
                       CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  for (local_24 = 0; local_24 < local_1c; local_24 = local_24 + 1) {
    local_28 = -1e+18;
    local_30 = (btVector3 *)(local_10 + (long)local_24 * 0x10);
    btVector3::btVector3(&local_40);
    local_58 = 0.0;
    local_5c = 0.0;
    local_60 = 0.0;
    btVector3::btVector3(&local_54,&local_58,&local_5c,&local_60);
    bVar3 = getHalfHeight((btCapsuleShape *)
                          CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    pbVar2 = btVector3::operator_cast_to_float_(&local_54);
    iVar1 = getUpAxis(in_RDI);
    pbVar2[iVar1] = bVar3;
    bVar4 = ::operator*(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8->m_floats);
    local_90 = bVar4.m_floats._0_8_;
    local_88 = bVar4.m_floats._8_8_;
    bVar4 = operator+(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    local_80 = bVar4.m_floats._0_8_;
    local_78 = bVar4.m_floats._8_8_;
    (*(in_RDI->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
      _vptr_btCollisionShape[0xc])();
    bVar4 = ::operator*(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8->m_floats);
    local_a0 = bVar4.m_floats._0_8_;
    local_98 = bVar4.m_floats._8_8_;
    bVar4 = operator-(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    local_70 = bVar4.m_floats._0_8_;
    local_68 = bVar4.m_floats._8_8_;
    local_40.m_floats._0_8_ = local_70;
    local_40.m_floats._8_8_ = local_68;
    local_44 = btVector3::dot(local_30,&local_40);
    if (local_28 < local_44) {
      pbVar2 = (btScalar *)(local_18 + (long)local_24 * 0x10);
      *(undefined8 *)pbVar2 = local_40.m_floats._0_8_;
      *(undefined8 *)(pbVar2 + 2) = local_40.m_floats._8_8_;
      local_28 = local_44;
    }
    local_b8 = 0.0;
    local_bc = 0.0;
    local_c0 = 0.0;
    in_stack_fffffffffffffec0 = &local_b4;
    btVector3::btVector3(in_stack_fffffffffffffec0,&local_b8,&local_bc,&local_c0);
    bVar3 = getHalfHeight((btCapsuleShape *)
                          CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    in_stack_fffffffffffffeb4 = -bVar3;
    in_stack_fffffffffffffeb8 =
         (btVector3 *)btVector3::operator_cast_to_float_(in_stack_fffffffffffffec0);
    iVar1 = getUpAxis(in_RDI);
    in_stack_fffffffffffffeb8->m_floats[iVar1] = in_stack_fffffffffffffeb4;
    ::operator*(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8->m_floats);
    operator+(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    (*(in_RDI->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
      _vptr_btCollisionShape[0xc])();
    ::operator*(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8->m_floats);
    bVar4 = operator-(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    local_40.m_floats._0_8_ = bVar4.m_floats._0_8_;
    local_40.m_floats._8_8_ = bVar4.m_floats._8_8_;
    local_44 = btVector3::dot(local_30,&local_40);
    if (local_28 < local_44) {
      pbVar2 = (btScalar *)(local_18 + (long)local_24 * 0x10);
      *(undefined8 *)pbVar2 = local_40.m_floats._0_8_;
      *(undefined8 *)(pbVar2 + 2) = local_40.m_floats._8_8_;
    }
  }
  return;
}

Assistant:

void	btCapsuleShape::batchedUnitVectorGetSupportingVertexWithoutMargin(const btVector3* vectors,btVector3* supportVerticesOut,int numVectors) const
{

	
	btScalar radius = getRadius();

	for (int j=0;j<numVectors;j++)
	{
		btScalar maxDot(btScalar(-BT_LARGE_FLOAT));
		const btVector3& vec = vectors[j];

		btVector3 vtx;
		btScalar newDot;
		{
			btVector3 pos(0,0,0);
			pos[getUpAxis()] = getHalfHeight();
			vtx = pos +vec*(radius) - vec * getMargin();
			newDot = vec.dot(vtx);
			if (newDot > maxDot)
			{
				maxDot = newDot;
				supportVerticesOut[j] = vtx;
			}
		}
		{
			btVector3 pos(0,0,0);
			pos[getUpAxis()] = -getHalfHeight();
			vtx = pos +vec*(radius) - vec * getMargin();
			newDot = vec.dot(vtx);
			if (newDot > maxDot)
			{
				maxDot = newDot;
				supportVerticesOut[j] = vtx;
			}
		}
		
	}
}